

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_16777232,_true,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::TriangleMiMBIntersectorKPluecker<4,_4,_true>_>,_true>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  float *pfVar1;
  undefined4 *puVar2;
  BVH *bvh;
  Ref<embree::Geometry> *pRVar3;
  long lVar4;
  RTCFilterFunctionN p_Var5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  undefined1 auVar9 [16];
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [12];
  Geometry *pGVar19;
  uint uVar20;
  AABBNodeMB4D *node1;
  ulong uVar21;
  size_t sVar22;
  ulong uVar23;
  undefined8 uVar24;
  ulong uVar25;
  int iVar26;
  undefined4 uVar27;
  long lVar28;
  Geometry *pGVar29;
  NodeRef root;
  BVH *pBVar30;
  uint uVar31;
  ulong uVar32;
  BVH *pBVar33;
  ulong uVar34;
  NodeRef *pNVar35;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar36;
  ulong uVar37;
  bool bVar38;
  float fVar39;
  float fVar49;
  float fVar50;
  vint4 ai;
  float fVar51;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  uint uVar52;
  uint uVar61;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  anon_union_16_2_9473010e_for_vint_impl<4>_1 aVar59;
  undefined1 auVar60 [16];
  undefined1 auVar62 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar63;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar71;
  float fVar73;
  undefined1 auVar72 [16];
  float fVar74;
  float fVar75;
  float fVar78;
  undefined4 uVar80;
  float fVar81;
  undefined4 uVar82;
  vint4 ai_1;
  float fVar79;
  float fVar83;
  undefined1 auVar77 [16];
  undefined4 uVar84;
  float fVar85;
  float fVar86;
  float fVar87;
  vint4 ai_3;
  float fVar88;
  float fVar89;
  float fVar94;
  float fVar95;
  vint4 bi_3;
  undefined1 auVar90 [16];
  float fVar96;
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  float fVar97;
  float fVar105;
  float fVar108;
  vint4 bi;
  float fVar98;
  float fVar99;
  float fVar111;
  undefined1 auVar100 [16];
  float fVar106;
  float fVar107;
  float fVar109;
  float fVar110;
  float fVar112;
  float fVar113;
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar104;
  float fVar114;
  float fVar115;
  float fVar116;
  float fVar120;
  float fVar123;
  vint4 bi_1;
  undefined1 auVar117 [16];
  anon_union_16_2_9473010e_for_vint_impl<4>_1 aVar118;
  float fVar121;
  float fVar122;
  float fVar124;
  float fVar125;
  float fVar126;
  float fVar127;
  float fVar128;
  undefined1 auVar119 [16];
  uint uVar129;
  uint uVar135;
  uint uVar136;
  vint4 ai_2;
  uint uVar137;
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  uint uVar138;
  uint uVar139;
  uint uVar140;
  vint4 bi_2;
  uint uVar141;
  float fVar142;
  float fVar143;
  float fVar144;
  float fVar147;
  float fVar148;
  float fVar149;
  float fVar150;
  float fVar151;
  float fVar152;
  float fVar153;
  float fVar154;
  float fVar155;
  float fVar156;
  float fVar157;
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  float fVar158;
  float fVar159;
  float fVar160;
  float fVar161;
  float fVar162;
  float fVar163;
  float fVar164;
  float fVar165;
  undefined4 in_XMM13_Da;
  undefined4 in_XMM13_Db;
  undefined4 in_XMM13_Dc;
  float fVar166;
  undefined4 in_XMM13_Dd;
  float fVar167;
  float fVar168;
  float fVar169;
  float fVar172;
  float fVar173;
  float fVar174;
  float fVar175;
  float fVar176;
  float fVar177;
  undefined1 auVar170 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar171;
  Precalculations pre;
  vuint<4> *v;
  float local_1a28;
  float fStack_1a24;
  float fStack_1a20;
  vint<4> itime;
  Vec3<embree::vfloat_impl<4>_> p1;
  vbool<4> terminated;
  OccludedFunc4 p_Stack_1990;
  undefined8 local_1988;
  undefined8 uStack_1980;
  uint local_1978;
  uint uStack_1974;
  uint uStack_1970;
  uint uStack_196c;
  Vec3<embree::vfloat_impl<4>_> p0;
  float local_18b8;
  float fStack_18b4;
  float fStack_18b0;
  float fStack_18ac;
  TravRayK<4,_true> tray;
  undefined1 local_17c8 [16];
  undefined1 local_17b8 [16];
  undefined1 local_17a8 [16];
  float local_1798;
  float fStack_1794;
  float fStack_1790;
  float fStack_178c;
  undefined8 local_1788;
  undefined8 uStack_1780;
  undefined1 local_1778 [8];
  float fStack_1770;
  float fStack_176c;
  undefined8 local_1768;
  undefined8 uStack_1760;
  undefined8 local_16f8;
  undefined8 uStack_16f0;
  undefined8 local_16e8;
  undefined8 uStack_16e0;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  undefined1 auVar53 [16];
  undefined1 auVar76 [16];
  
  bvh = (BVH *)This->ptr;
  sVar22 = (bvh->root).ptr;
  if (sVar22 != 8) {
    auVar90 = *(undefined1 (*) [16])(ray + 0x80);
    auVar132._0_12_ = ZEXT812(0);
    auVar132._12_4_ = 0;
    uVar52 = -(uint)((valid_i->field_0).i[0] == -1 && 0.0 <= auVar90._0_4_);
    uVar61 = -(uint)((valid_i->field_0).i[1] == -1 && 0.0 <= auVar90._4_4_);
    auVar53._0_8_ = CONCAT44(uVar61,uVar52);
    auVar53._8_4_ = -(uint)((valid_i->field_0).i[2] == -1 && 0.0 <= auVar90._8_4_);
    auVar53._12_4_ = -(uint)((valid_i->field_0).i[3] == -1 && 0.0 <= auVar90._12_4_);
    iVar26 = movmskps((int)context,auVar53);
    if (iVar26 != 0) {
      tray.org.field_0._0_8_ = *(undefined8 *)ray;
      tray.org.field_0._8_8_ = *(undefined8 *)(ray + 8);
      tray.org.field_0._16_8_ = *(undefined8 *)(ray + 0x10);
      tray.org.field_0._24_8_ = *(undefined8 *)(ray + 0x18);
      tray.org.field_0._32_8_ = *(undefined8 *)(ray + 0x20);
      tray.org.field_0._40_8_ = *(undefined8 *)(ray + 0x28);
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      auVar117 = divps(_DAT_01f7ba10,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      fVar142 = (float)DAT_01f80d30;
      fVar147 = DAT_01f80d30._4_4_;
      fVar151 = DAT_01f80d30._8_4_;
      fVar154 = DAT_01f80d30._12_4_;
      auVar62._4_4_ = -(uint)(ABS(tray.dir.field_0._4_4_) < fVar147);
      auVar62._0_4_ = -(uint)(ABS(tray.dir.field_0._0_4_) < fVar142);
      auVar62._8_4_ = -(uint)(ABS(tray.dir.field_0._8_4_) < fVar151);
      auVar62._12_4_ = -(uint)(ABS(tray.dir.field_0._12_4_) < fVar154);
      auVar70 = divps(_DAT_01f7ba10,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar146._4_4_ = -(uint)(ABS(tray.dir.field_0._20_4_) < fVar147);
      auVar146._0_4_ = -(uint)(ABS(tray.dir.field_0._16_4_) < fVar142);
      auVar54 = divps(_DAT_01f7ba10,(undefined1  [16])tray.dir.field_0.field_0.z.field_0);
      tray.rdir.field_0.field_0.x.field_0 = (vfloat_impl<4>)blendvps(auVar117,_DAT_01fab950,auVar62)
      ;
      auVar146._8_4_ = -(uint)(ABS(tray.dir.field_0._24_4_) < fVar151);
      auVar146._12_4_ = -(uint)(ABS(tray.dir.field_0._28_4_) < fVar154);
      tray.rdir.field_0.field_0.y.field_0 = (vfloat_impl<4>)blendvps(auVar70,_DAT_01fab950,auVar146)
      ;
      auVar70._4_4_ = -(uint)(ABS(tray.dir.field_0._36_4_) < fVar147);
      auVar70._0_4_ = -(uint)(ABS(tray.dir.field_0._32_4_) < fVar142);
      auVar70._8_4_ = -(uint)(ABS(tray.dir.field_0._40_4_) < fVar151);
      auVar70._12_4_ = -(uint)(ABS(tray.dir.field_0._44_4_) < fVar154);
      tray.rdir.field_0.field_0.z.field_0 = (vfloat_impl<4>)blendvps(auVar54,_DAT_01fab950,auVar70);
      aVar118._0_8_ =
           CONCAT44(-(uint)(tray.rdir.field_0._4_4_ < 0.0),-(uint)(tray.rdir.field_0._0_4_ < 0.0)) &
           0x1000000010;
      aVar118.i[2] = -(uint)(tray.rdir.field_0._8_4_ < 0.0) & 0x10;
      aVar118.i[3] = -(uint)(tray.rdir.field_0._12_4_ < 0.0) & 0x10;
      auVar54._4_4_ = -(uint)(0.0 <= tray.rdir.field_0._20_4_);
      auVar54._0_4_ = -(uint)(0.0 <= tray.rdir.field_0._16_4_);
      auVar54._8_4_ = -(uint)(0.0 <= tray.rdir.field_0._24_4_);
      auVar54._12_4_ = -(uint)(0.0 <= tray.rdir.field_0._28_4_);
      tray.nearXYZ.field_0.field_0.y.field_0 =
           (vint_impl<4>)blendvps(_DAT_01faeed0,_DAT_01f8c1f0,auVar54);
      tray.nearXYZ.field_0.field_0.x.field_0 = (vint_impl<4>)(vint_impl<4>)aVar118;
      auVar117._4_4_ = -(uint)(0.0 <= tray.rdir.field_0._36_4_);
      auVar117._0_4_ = -(uint)(0.0 <= tray.rdir.field_0._32_4_);
      auVar117._8_4_ = -(uint)(0.0 <= tray.rdir.field_0._40_4_);
      auVar117._12_4_ = -(uint)(0.0 <= tray.rdir.field_0._44_4_);
      tray.nearXYZ.field_0.field_0.z.field_0 =
           (vint_impl<4>)blendvps(_DAT_01faeef0,_DAT_01faeee0,auVar117);
      auVar62 = maxps(*(undefined1 (*) [16])(ray + 0x30),auVar132);
      tray.tnear.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
           blendvps((undefined1  [16])_DAT_01f7a9f0,auVar62,auVar53);
      auVar90 = maxps(auVar90,auVar132);
      tray.tfar.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)blendvps(_DAT_01f7aa00,auVar90,auVar53);
      terminated.field_0._0_8_ = auVar53._0_8_ ^ 0xffffffffffffffff;
      terminated.field_0.i[2] = auVar53._8_4_ ^ 0xffffffff;
      terminated.field_0.i[3] = auVar53._12_4_ ^ 0xffffffff;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar31 = 3;
      }
      else {
        uVar31 = ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                 RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
      }
      pNVar35 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar36 = &stack_near[2].field_0;
      stack_near[0].field_0 = _DAT_01f7a9f0;
      stack_node[1].ptr = sVar22;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
      pBVar30 = (BVH *)This;
      aVar171 = _DAT_01f7a9f0;
LAB_00dbc5f6:
      do {
        do {
          root.ptr = pNVar35[-1].ptr;
          if (root.ptr == 0xfffffffffffffff8) goto LAB_00dbd6d2;
          pNVar35 = pNVar35 + -1;
          paVar36 = paVar36 + -1;
          aVar63.v = *(__m128 *)paVar36->v;
          auVar90._4_4_ = -(uint)(aVar63.v[1] < tray.tfar.field_0.v[1]);
          auVar90._0_4_ = -(uint)(aVar63.v[0] < tray.tfar.field_0.v[0]);
          auVar90._8_4_ = -(uint)(aVar63.v[2] < tray.tfar.field_0.v[2]);
          auVar90._12_4_ = -(uint)(aVar63._12_4_ < tray.tfar.field_0.v[3]);
          uVar20 = movmskps((int)sVar22,auVar90);
          sVar22 = (size_t)uVar20;
        } while (uVar20 == 0);
        uVar21 = (ulong)(byte)uVar20;
        if (uVar31 < (uint)POPCOUNT(uVar20 & 0xff)) {
LAB_00dbc637:
          do {
            uVar20 = (uint)root.ptr;
            fVar142 = aVar63.v[0];
            fVar147 = aVar63.v[1];
            fVar151 = aVar63.v[2];
            fVar154 = aVar63.v[3];
            if ((root.ptr & 8) != 0) {
              if ((BVH *)root.ptr == (BVH *)&DAT_fffffffffffffff8) goto LAB_00dbd6d2;
              auVar42._4_4_ = -(uint)(fVar147 < tray.tfar.field_0.v[1]);
              auVar42._0_4_ = -(uint)(fVar142 < tray.tfar.field_0.v[0]);
              auVar42._8_4_ = -(uint)(fVar151 < tray.tfar.field_0.v[2]);
              auVar42._12_4_ = -(uint)(fVar154 < tray.tfar.field_0.v[3]);
              uVar129 = movmskps((int)sVar22,auVar42);
              sVar22 = (size_t)uVar129;
              if (uVar129 != 0) {
                uVar21 = (ulong)(uVar20 & 0xf);
                aVar104 = terminated.field_0;
                if (uVar21 != 8) {
                  uVar25 = 0;
                  auVar100._8_4_ = terminated.field_0._8_4_ ^ 0xffffffff;
                  auVar100._0_8_ = terminated.field_0._0_8_ ^ 0xffffffffffffffff;
                  auVar100._12_4_ = terminated.field_0._12_4_ ^ 0xffffffff;
                  do {
                    lVar28 = uVar25 * 0x50 + (root.ptr & 0xfffffffffffffff0);
                    uVar27 = movmskps((int)pBVar30,auVar100);
                    pBVar30 = (BVH *)CONCAT44((int)((ulong)pBVar30 >> 0x20),uVar27);
                    uVar23 = uVar25;
                    uVar37 = 0;
                    auVar90 = auVar100;
                    while (aVar63 = _DAT_01f7a9f0, *(int *)(lVar28 + 0x40 + uVar37 * 4) != -1) {
                      pRVar3 = (context->scene->geometries).items;
                      pGVar29 = pRVar3[*(uint *)(lVar28 + 0x30 + uVar37 * 4)].ptr;
                      uVar27 = pGVar29->fnumTimeSegments;
                      fVar142 = (pGVar29->time_range).lower;
                      auVar64._0_4_ = (pGVar29->time_range).upper - fVar142;
                      auVar131._0_4_ = *(float *)(ray + 0x70) - fVar142;
                      auVar131._4_4_ = *(float *)(ray + 0x74) - fVar142;
                      auVar131._8_4_ = *(float *)(ray + 0x78) - fVar142;
                      auVar131._12_4_ = *(float *)(ray + 0x7c) - fVar142;
                      auVar64._4_4_ = auVar64._0_4_;
                      auVar64._8_4_ = auVar64._0_4_;
                      auVar64._12_4_ = auVar64._0_4_;
                      auVar132 = divps(auVar131,auVar64);
                      auVar133._0_4_ = auVar132._0_4_ * (float)uVar27;
                      auVar133._4_4_ = auVar132._4_4_ * (float)uVar27;
                      auVar133._8_4_ = auVar132._8_4_ * (float)uVar27;
                      auVar133._12_4_ = auVar132._12_4_ * (float)uVar27;
                      auVar132 = roundps(auVar64,auVar133,1);
                      auVar55._0_4_ = (float)uVar27 + -1.0;
                      auVar55._4_4_ = auVar55._0_4_;
                      auVar55._8_4_ = auVar55._0_4_;
                      auVar55._12_4_ = auVar55._0_4_;
                      auVar132 = minps(auVar132,auVar55);
                      auVar132 = maxps(auVar132,_DAT_01f7aa10);
                      fVar142 = auVar133._0_4_ - auVar132._0_4_;
                      fVar147 = auVar133._4_4_ - auVar132._4_4_;
                      fVar151 = auVar133._8_4_ - auVar132._8_4_;
                      fVar154 = auVar133._12_4_ - auVar132._12_4_;
                      itime.field_0.i[0] = (int)auVar132._0_4_;
                      itime.field_0.i[1] = (int)auVar132._4_4_;
                      itime.field_0.i[2] = (int)auVar132._8_4_;
                      itime.field_0.i[3] = (int)auVar132._12_4_;
                      uVar23 = 0;
                      if (pBVar30 != (BVH *)0x0) {
                        for (; ((ulong)pBVar30 >> uVar23 & 1) == 0; uVar23 = uVar23 + 1) {
                        }
                      }
                      iVar26 = itime.field_0.i[uVar23];
                      auVar65._0_4_ = -(uint)(iVar26 == itime.field_0.i[0]);
                      auVar65._4_4_ = -(uint)(iVar26 == itime.field_0.i[1]);
                      auVar65._8_4_ = -(uint)(iVar26 == itime.field_0.i[2]);
                      auVar65._12_4_ = -(uint)(iVar26 == itime.field_0.i[3]);
                      auVar66 = ~auVar65 & auVar100;
                      uVar20 = movmskps((int)valid_i,auVar66);
                      valid_i = (vint<4> *)(ulong)uVar20;
                      if (uVar20 == 0) {
                        pGVar19 = pGVar29 + 2;
                        pGVar29 = *(Geometry **)
                                   (*(long *)&pGVar19->numPrimitives + (long)iVar26 * 0x38);
                        lVar4 = *(long *)(*(long *)&pGVar19->numPrimitives + 0x38 +
                                         (long)iVar26 * 0x38);
                        valid_i = (vint<4> *)(ulong)*(uint *)(lVar28 + uVar37 * 4);
                        uVar23 = (ulong)*(uint *)(lVar28 + 0x10 + uVar37 * 4);
                        pfVar1 = (float *)((long)&(pGVar29->super_RefCount)._vptr_RefCount +
                                          (long)valid_i * 4);
                        fVar51 = *pfVar1;
                        fVar74 = pfVar1[1];
                        fVar89 = pfVar1[2];
                        pfVar1 = (float *)(lVar4 + (long)valid_i * 4);
                        fVar83 = *pfVar1;
                        fVar94 = pfVar1[1];
                        fVar85 = pfVar1[2];
                        fVar123 = 1.0 - fVar142;
                        fVar148 = 1.0 - fVar147;
                        fVar155 = 1.0 - fVar151;
                        fVar73 = 1.0 - fVar154;
                        fVar158 = fVar51 * fVar123 + fVar83 * fVar142;
                        fVar160 = fVar51 * fVar148 + fVar83 * fVar147;
                        fVar162 = fVar51 * fVar155 + fVar83 * fVar151;
                        fVar164 = fVar51 * fVar73 + fVar83 * fVar154;
                        fVar98 = fVar74 * fVar123 + fVar94 * fVar142;
                        fVar106 = fVar74 * fVar148 + fVar94 * fVar147;
                        fVar109 = fVar74 * fVar155 + fVar94 * fVar151;
                        fVar112 = fVar74 * fVar73 + fVar94 * fVar154;
                        fVar39 = fVar89 * fVar123 + fVar85 * fVar142;
                        fVar49 = fVar89 * fVar148 + fVar85 * fVar147;
                        fVar50 = fVar89 * fVar155 + fVar85 * fVar151;
                        fVar78 = fVar89 * fVar73 + fVar85 * fVar154;
                        pfVar1 = (float *)((long)&(pGVar29->super_RefCount)._vptr_RefCount +
                                          uVar23 * 4);
                        fVar51 = *pfVar1;
                        fVar74 = pfVar1[1];
                        fVar89 = pfVar1[2];
                        pfVar1 = (float *)(lVar4 + uVar23 * 4);
                        fVar83 = *pfVar1;
                        fVar96 = pfVar1[1];
                        fVar126 = pfVar1[2];
                        fVar94 = fVar51 * fVar123 + fVar83 * fVar142;
                        fVar85 = fVar51 * fVar148 + fVar83 * fVar147;
                        fVar88 = fVar51 * fVar155 + fVar83 * fVar151;
                        fVar95 = fVar51 * fVar73 + fVar83 * fVar154;
                        fVar105 = fVar74 * fVar123 + fVar96 * fVar142;
                        fVar108 = fVar74 * fVar148 + fVar96 * fVar147;
                        fVar111 = fVar74 * fVar155 + fVar96 * fVar151;
                        fVar114 = fVar74 * fVar73 + fVar96 * fVar154;
                        fVar143 = fVar89 * fVar123 + fVar126 * fVar142;
                        fVar149 = fVar89 * fVar148 + fVar126 * fVar147;
                        fVar152 = fVar89 * fVar155 + fVar126 * fVar151;
                        fVar156 = fVar89 * fVar73 + fVar126 * fVar154;
                        uVar23 = (ulong)*(uint *)(lVar28 + 0x20 + uVar37 * 4);
                        pfVar1 = (float *)(lVar4 + uVar23 * 4);
                        fVar51 = *pfVar1;
                        fVar74 = pfVar1[1];
                        fVar89 = pfVar1[2];
                        pfVar1 = (float *)((long)&(pGVar29->super_RefCount)._vptr_RefCount +
                                          uVar23 * 4);
                        fVar83 = *pfVar1;
                        fVar97 = pfVar1[1];
                        fVar120 = pfVar1[2];
                        fVar96 = fVar83 * fVar123 + fVar51 * fVar142;
                        fVar126 = fVar83 * fVar148 + fVar51 * fVar147;
                        fVar166 = fVar83 * fVar155 + fVar51 * fVar151;
                        fVar167 = fVar83 * fVar73 + fVar51 * fVar154;
                        fVar81 = fVar97 * fVar123 + fVar74 * fVar142;
                        fVar86 = fVar97 * fVar148 + fVar74 * fVar147;
                        fVar87 = fVar97 * fVar155 + fVar74 * fVar151;
                        fVar97 = fVar97 * fVar73 + fVar74 * fVar154;
                        fVar142 = fVar120 * fVar123 + fVar89 * fVar142;
                        fVar147 = fVar120 * fVar148 + fVar89 * fVar147;
                        fVar151 = fVar120 * fVar155 + fVar89 * fVar151;
                        fVar154 = fVar120 * fVar73 + fVar89 * fVar154;
                      }
                      else {
                        uVar80 = uVar27;
                        uVar82 = uVar27;
                        uVar84 = uVar27;
                        if (pBVar30 != (BVH *)0x0) {
                          lVar4 = *(long *)&pGVar29[2].numPrimitives;
                          valid_i = (vint<4> *)(lVar4 + 0x38);
                          uVar32 = (ulong)*(uint *)(lVar28 + uVar37 * 4);
                          pBVar33 = pBVar30;
                          uVar34 = uVar23;
                          do {
                            auVar132 = *(undefined1 (*) [16])
                                        (*(long *)(lVar4 + (long)itime.field_0.i[uVar34] * 0x38) +
                                        uVar32 * 4);
                            auVar66 = *(undefined1 (*) [16])
                                       ((long)&((&((Intersectors *)valid_i)->ptr)
                                                [(long)itime.field_0.i[uVar34] * 7]->super_RefCount)
                                               ._vptr_RefCount + uVar32 * 4);
                            *(int *)((long)&p0.field_0 + uVar34 * 4) = auVar132._0_4_;
                            uVar24 = extractps(auVar132,1);
                            *(undefined8 *)((long)&p0.field_0 + uVar34 * 4 + 0x10) = uVar24;
                            uVar24 = extractps(auVar132,2);
                            *(undefined8 *)((long)&p0.field_0 + uVar34 * 4 + 0x20) = uVar24;
                            *(int *)((long)&p1.field_0 + uVar34 * 4) = auVar66._0_4_;
                            uVar24 = extractps(auVar66,1);
                            *(undefined8 *)((long)&p1.field_0 + uVar34 * 4 + 0x10) = uVar24;
                            uVar24 = extractps(auVar66,2);
                            *(undefined8 *)((long)&p1.field_0 + uVar34 * 4 + 0x20) = uVar24;
                            pBVar33 = (BVH *)((ulong)pBVar33 ^ 1L << (uVar34 & 0x3f));
                            uVar34 = 0;
                            if (pBVar33 != (BVH *)0x0) {
                              for (; ((ulong)pBVar33 >> uVar34 & 1) == 0; uVar34 = uVar34 + 1) {
                              }
                            }
                          } while (pBVar33 != (BVH *)0x0);
                          local_1988 = (char *)p1.field_0._0_8_;
                          uStack_1980 = (IntersectFunc8)CONCAT44(p1.field_0._12_4_,p1.field_0._8_4_)
                          ;
                          uVar27 = p0.field_0._0_4_;
                          uVar80 = p0.field_0._4_4_;
                          uVar82 = p0.field_0._8_4_;
                          uVar84 = p0.field_0._12_4_;
                        }
                        fVar51 = 1.0 - fVar142;
                        fVar74 = 1.0 - fVar147;
                        fVar89 = 1.0 - fVar151;
                        fVar83 = 1.0 - fVar154;
                        fVar98 = (float)p0.field_0._16_4_ * fVar51;
                        fVar106 = (float)p0.field_0._20_4_ * fVar74;
                        fVar109 = (float)p0.field_0._24_4_ * fVar89;
                        fVar112 = (float)p0.field_0._28_4_ * fVar83;
                        fVar39 = (float)p0.field_0._32_4_ * fVar51;
                        fVar49 = (float)p0.field_0._36_4_ * fVar74;
                        fVar50 = (float)p0.field_0._40_4_ * fVar89;
                        fVar78 = (float)p0.field_0._44_4_ * fVar83;
                        fVar94 = (float)p1.field_0._16_4_ * fVar142;
                        fVar85 = (float)p1.field_0._20_4_ * fVar147;
                        fVar88 = (float)p1.field_0._24_4_ * fVar151;
                        fVar95 = (float)p1.field_0._28_4_ * fVar154;
                        fVar96 = (float)p1.field_0._32_4_ * fVar142;
                        fVar126 = (float)p1.field_0._36_4_ * fVar147;
                        fVar166 = (float)p1.field_0._40_4_ * fVar151;
                        fVar167 = (float)p1.field_0._44_4_ * fVar154;
                        if (pBVar30 != (BVH *)0x0) {
                          lVar4 = *(long *)&pGVar29[2].numPrimitives;
                          valid_i = (vint<4> *)(lVar4 + 0x38);
                          uVar32 = (ulong)*(uint *)(lVar28 + 0x10 + uVar37 * 4);
                          pBVar33 = pBVar30;
                          uVar34 = uVar23;
                          do {
                            auVar132 = *(undefined1 (*) [16])
                                        (*(long *)(lVar4 + (long)itime.field_0.i[uVar34] * 0x38) +
                                        uVar32 * 4);
                            auVar62 = *(undefined1 (*) [16])
                                       ((long)&((&((Intersectors *)valid_i)->ptr)
                                                [(long)itime.field_0.i[uVar34] * 7]->super_RefCount)
                                               ._vptr_RefCount + uVar32 * 4);
                            *(int *)((long)&p0.field_0 + uVar34 * 4) = auVar132._0_4_;
                            uVar24 = extractps(auVar132,1);
                            *(undefined8 *)((long)&p0.field_0 + uVar34 * 4 + 0x10) = uVar24;
                            uVar24 = extractps(auVar132,2);
                            *(undefined8 *)((long)&p0.field_0 + uVar34 * 4 + 0x20) = uVar24;
                            *(int *)((long)&p1.field_0 + uVar34 * 4) = auVar62._0_4_;
                            uVar24 = extractps(auVar62,1);
                            *(undefined8 *)((long)&p1.field_0 + uVar34 * 4 + 0x10) = uVar24;
                            uVar24 = extractps(auVar62,2);
                            *(undefined8 *)((long)&p1.field_0 + uVar34 * 4 + 0x20) = uVar24;
                            pBVar33 = (BVH *)((ulong)pBVar33 ^ 1L << (uVar34 & 0x3f));
                            uVar34 = 0;
                            if (pBVar33 != (BVH *)0x0) {
                              for (; ((ulong)pBVar33 >> uVar34 & 1) == 0; uVar34 = uVar34 + 1) {
                              }
                            }
                          } while (pBVar33 != (BVH *)0x0);
                          aVar118.i[1] = p0.field_0._4_4_;
                          aVar118.i[0] = p0.field_0._0_4_;
                          aVar118.i[2] = p0.field_0._8_4_;
                          aVar118.i[3] = p0.field_0._12_4_;
                          auVar66._8_4_ = p1.field_0._8_4_;
                          auVar66._0_8_ = p1.field_0._0_8_;
                          auVar66._12_4_ = p1.field_0._12_4_;
                        }
                        fVar105 = (float)p0.field_0._16_4_ * fVar51;
                        fVar108 = (float)p0.field_0._20_4_ * fVar74;
                        fVar111 = (float)p0.field_0._24_4_ * fVar89;
                        fVar114 = (float)p0.field_0._28_4_ * fVar83;
                        fVar143 = (float)p0.field_0._32_4_ * fVar51;
                        fVar149 = (float)p0.field_0._36_4_ * fVar74;
                        fVar152 = (float)p0.field_0._40_4_ * fVar89;
                        fVar156 = (float)p0.field_0._44_4_ * fVar83;
                        fVar81 = (float)p1.field_0._16_4_ * fVar142;
                        fVar86 = (float)p1.field_0._20_4_ * fVar147;
                        fVar87 = (float)p1.field_0._24_4_ * fVar151;
                        fVar97 = (float)p1.field_0._28_4_ * fVar154;
                        fVar120 = (float)p1.field_0._32_4_ * fVar142;
                        fVar123 = (float)p1.field_0._36_4_ * fVar147;
                        fVar148 = (float)p1.field_0._40_4_ * fVar151;
                        fVar155 = (float)p1.field_0._44_4_ * fVar154;
                        auVar102 = auVar100;
                        uVar24 = CONCAT44(in_XMM13_Db,in_XMM13_Da);
                        if (pBVar30 != (BVH *)0x0) {
                          pGVar29 = *(Geometry **)&pGVar29[2].numPrimitives;
                          valid_i = (vint<4> *)(ulong)*(uint *)(lVar28 + 0x20 + uVar37 * 4);
                          pBVar33 = pBVar30;
                          do {
                            puVar2 = (undefined4 *)
                                     (*(long *)((long)&pGVar29->super_RefCount +
                                               (long)itime.field_0.i[uVar23] * 0x38) +
                                     (long)valid_i * 4);
                            uVar14 = puVar2[1];
                            uVar15 = puVar2[2];
                            auVar132 = *(undefined1 (*) [16])
                                        (*(long *)(&pGVar29->modCounter_ +
                                                  (long)itime.field_0.i[uVar23] * 0xe) +
                                        (long)valid_i * 4);
                            *(undefined4 *)((long)&p0.field_0 + uVar23 * 4) = *puVar2;
                            *(undefined4 *)((long)&p0.field_0 + uVar23 * 4 + 0x10) = uVar14;
                            *(undefined4 *)((long)&p0.field_0 + uVar23 * 4 + 0x20) = uVar15;
                            *(int *)((long)&p1.field_0 + uVar23 * 4) = auVar132._0_4_;
                            uVar24 = extractps(auVar132,1);
                            *(undefined8 *)((long)&p1.field_0 + uVar23 * 4 + 0x10) = uVar24;
                            uVar24 = extractps(auVar132,2);
                            *(undefined8 *)((long)&p1.field_0 + uVar23 * 4 + 0x20) = uVar24;
                            pBVar33 = (BVH *)((ulong)pBVar33 ^ 1L << (uVar23 & 0x3f));
                            uVar23 = 0;
                            if (pBVar33 != (BVH *)0x0) {
                              for (; ((ulong)pBVar33 >> uVar23 & 1) == 0; uVar23 = uVar23 + 1) {
                              }
                            }
                          } while (pBVar33 != (BVH *)0x0);
                          auVar102._4_4_ = p0.field_0._4_4_;
                          auVar102._0_4_ = p0.field_0._0_4_;
                          auVar102._8_4_ = p0.field_0._8_4_;
                          auVar102._12_4_ = p0.field_0._12_4_;
                          in_XMM13_Dc = p1.field_0._8_4_;
                          in_XMM13_Dd = p1.field_0._12_4_;
                          uVar24 = p1.field_0._0_8_;
                        }
                        fVar158 = (float)local_1988 * fVar142 + (float)uVar27 * fVar51;
                        fVar160 = local_1988._4_4_ * fVar147 + (float)uVar80 * fVar74;
                        fVar162 = (float)uStack_1980 * fVar151 + (float)uVar82 * fVar89;
                        fVar164 = uStack_1980._4_4_ * fVar154 + (float)uVar84 * fVar83;
                        fVar98 = fVar98 + fVar94;
                        fVar106 = fVar106 + fVar85;
                        fVar109 = fVar109 + fVar88;
                        fVar112 = fVar112 + fVar95;
                        fVar39 = fVar39 + fVar96;
                        fVar49 = fVar49 + fVar126;
                        fVar50 = fVar50 + fVar166;
                        fVar78 = fVar78 + fVar167;
                        fVar94 = auVar66._0_4_ * fVar142 + aVar118.i[0] * fVar51;
                        fVar85 = auVar66._4_4_ * fVar147 + aVar118.i[1] * fVar74;
                        fVar88 = auVar66._8_4_ * fVar151 + aVar118.i[2] * fVar89;
                        fVar95 = auVar66._12_4_ * fVar154 + aVar118.i[3] * fVar83;
                        fVar105 = fVar105 + fVar81;
                        fVar108 = fVar108 + fVar86;
                        fVar111 = fVar111 + fVar87;
                        fVar114 = fVar114 + fVar97;
                        fVar143 = fVar143 + fVar120;
                        fVar149 = fVar149 + fVar123;
                        fVar152 = fVar152 + fVar148;
                        fVar156 = fVar156 + fVar155;
                        fVar96 = (float)uVar24 * fVar142 + auVar102._0_4_ * fVar51;
                        fVar126 = (float)((ulong)uVar24 >> 0x20) * fVar147 + auVar102._4_4_ * fVar74
                        ;
                        fVar166 = (float)in_XMM13_Dc * fVar151 + auVar102._8_4_ * fVar89;
                        fVar167 = (float)in_XMM13_Dd * fVar154 + auVar102._12_4_ * fVar83;
                        fVar81 = (float)p1.field_0._16_4_ * fVar142 +
                                 (float)p0.field_0._16_4_ * fVar51;
                        fVar86 = (float)p1.field_0._20_4_ * fVar147 +
                                 (float)p0.field_0._20_4_ * fVar74;
                        fVar87 = (float)p1.field_0._24_4_ * fVar151 +
                                 (float)p0.field_0._24_4_ * fVar89;
                        fVar97 = (float)p1.field_0._28_4_ * fVar154 +
                                 (float)p0.field_0._28_4_ * fVar83;
                        fVar142 = fVar142 * (float)p1.field_0._32_4_ +
                                  fVar51 * (float)p0.field_0._32_4_;
                        fVar147 = fVar147 * (float)p1.field_0._36_4_ +
                                  fVar74 * (float)p0.field_0._36_4_;
                        fVar151 = fVar151 * (float)p1.field_0._40_4_ +
                                  fVar89 * (float)p0.field_0._40_4_;
                        fVar154 = fVar154 * (float)p1.field_0._44_4_ +
                                  fVar83 * (float)p0.field_0._44_4_;
                      }
                      local_16e8 = *(undefined8 *)(lVar28 + 0x30);
                      uStack_16e0 = *(undefined8 *)(lVar28 + 0x38);
                      local_16f8 = *(undefined8 *)(lVar28 + 0x40);
                      uStack_16f0 = *(undefined8 *)(lVar28 + 0x48);
                      fVar51 = *(float *)ray;
                      fVar74 = *(float *)(ray + 4);
                      fVar89 = *(float *)(ray + 8);
                      fVar83 = *(float *)(ray + 0xc);
                      fVar120 = *(float *)(ray + 0x10);
                      fVar123 = *(float *)(ray + 0x14);
                      fVar148 = *(float *)(ray + 0x18);
                      fVar155 = *(float *)(ray + 0x1c);
                      fVar73 = *(float *)(ray + 0x20);
                      fVar75 = *(float *)(ray + 0x24);
                      fVar79 = *(float *)(ray + 0x28);
                      fVar99 = *(float *)(ray + 0x2c);
                      fVar10 = *(float *)(ray + 0x40);
                      fVar11 = *(float *)(ray + 0x44);
                      fVar12 = *(float *)(ray + 0x48);
                      fVar13 = *(float *)(ray + 0x4c);
                      fVar158 = fVar158 - fVar51;
                      fVar160 = fVar160 - fVar74;
                      fVar162 = fVar162 - fVar89;
                      fVar164 = fVar164 - fVar83;
                      fVar98 = fVar98 - fVar120;
                      fVar106 = fVar106 - fVar123;
                      fVar109 = fVar109 - fVar148;
                      fVar112 = fVar112 - fVar155;
                      fVar39 = fVar39 - fVar73;
                      fVar49 = fVar49 - fVar75;
                      fVar50 = fVar50 - fVar79;
                      fVar78 = fVar78 - fVar99;
                      fVar94 = fVar94 - fVar51;
                      fVar85 = fVar85 - fVar74;
                      fVar88 = fVar88 - fVar89;
                      fVar95 = fVar95 - fVar83;
                      fVar105 = fVar105 - fVar120;
                      fVar108 = fVar108 - fVar123;
                      fVar111 = fVar111 - fVar148;
                      fVar114 = fVar114 - fVar155;
                      fVar143 = fVar143 - fVar73;
                      fVar149 = fVar149 - fVar75;
                      fVar152 = fVar152 - fVar79;
                      fVar156 = fVar156 - fVar99;
                      fVar96 = fVar96 - fVar51;
                      fVar126 = fVar126 - fVar74;
                      fVar166 = fVar166 - fVar89;
                      fVar167 = fVar167 - fVar83;
                      fVar81 = fVar81 - fVar120;
                      fVar86 = fVar86 - fVar123;
                      fVar87 = fVar87 - fVar148;
                      fVar97 = fVar97 - fVar155;
                      fVar142 = fVar142 - fVar73;
                      fVar147 = fVar147 - fVar75;
                      fVar151 = fVar151 - fVar79;
                      fVar154 = fVar154 - fVar99;
                      fVar168 = fVar96 - fVar158;
                      fVar172 = fVar126 - fVar160;
                      fVar174 = fVar166 - fVar162;
                      fVar176 = fVar167 - fVar164;
                      fVar115 = fVar81 - fVar98;
                      fVar121 = fVar86 - fVar106;
                      fVar124 = fVar87 - fVar109;
                      fVar127 = fVar97 - fVar112;
                      fVar74 = fVar142 - fVar39;
                      fVar83 = fVar147 - fVar49;
                      fVar123 = fVar151 - fVar50;
                      fVar155 = fVar154 - fVar78;
                      auVar18 = *(undefined1 (*) [12])(ray + 0x60);
                      fVar51 = *(float *)(ray + 0x6c);
                      fVar169 = fVar158 - fVar94;
                      fVar173 = fVar160 - fVar85;
                      fVar175 = fVar162 - fVar88;
                      fVar177 = fVar164 - fVar95;
                      local_18b8 = (float)*(undefined8 *)(ray + 0x50);
                      fStack_18b4 = (float)((ulong)*(undefined8 *)(ray + 0x50) >> 0x20);
                      fStack_18b0 = (float)*(undefined8 *)(ray + 0x58);
                      fStack_18ac = (float)((ulong)*(undefined8 *)(ray + 0x58) >> 0x20);
                      fVar144 = fVar98 - fVar105;
                      fVar150 = fVar106 - fVar108;
                      fVar153 = fVar109 - fVar111;
                      fVar157 = fVar112 - fVar114;
                      fVar75 = (fVar115 * (fVar142 + fVar39) - (fVar81 + fVar98) * fVar74) * fVar10
                               + ((fVar96 + fVar158) * fVar74 - (fVar142 + fVar39) * fVar168) *
                                 local_18b8 +
                                 (fVar168 * (fVar81 + fVar98) - (fVar96 + fVar158) * fVar115) *
                                 *(float *)(ray + 0x60);
                      fVar79 = (fVar121 * (fVar147 + fVar49) - (fVar86 + fVar106) * fVar83) * fVar11
                               + ((fVar126 + fVar160) * fVar83 - (fVar147 + fVar49) * fVar172) *
                                 fStack_18b4 +
                                 (fVar172 * (fVar86 + fVar106) - (fVar126 + fVar160) * fVar121) *
                                 *(float *)(ray + 100);
                      auVar76._0_8_ = CONCAT44(fVar79,fVar75);
                      auVar76._8_4_ =
                           (fVar124 * (fVar151 + fVar50) - (fVar87 + fVar109) * fVar123) * fVar12 +
                           ((fVar166 + fVar162) * fVar123 - (fVar151 + fVar50) * fVar174) *
                           fStack_18b0 +
                           (fVar174 * (fVar87 + fVar109) - (fVar166 + fVar162) * fVar124) *
                           *(float *)(ray + 0x68);
                      auVar76._12_4_ =
                           (fVar127 * (fVar154 + fVar78) - (fVar97 + fVar112) * fVar155) * fVar13 +
                           ((fVar167 + fVar164) * fVar155 - (fVar154 + fVar78) * fVar176) *
                           fStack_18ac +
                           (fVar176 * (fVar97 + fVar112) - (fVar167 + fVar164) * fVar127) * fVar51;
                      fVar89 = fVar39 - fVar143;
                      fVar120 = fVar49 - fVar149;
                      fVar148 = fVar50 - fVar152;
                      fVar73 = fVar78 - fVar156;
                      local_1988 = (char *)CONCAT44(fVar160,fVar158);
                      uStack_1980 = (IntersectFunc8)CONCAT44(fVar164,fVar162);
                      local_1a28 = auVar18._0_4_;
                      fStack_1a24 = auVar18._4_4_;
                      fStack_1a20 = auVar18._8_4_;
                      auVar72._0_4_ =
                           (fVar144 * (fVar39 + fVar143) - (fVar98 + fVar105) * fVar89) * fVar10 +
                           ((fVar158 + fVar94) * fVar89 - (fVar39 + fVar143) * fVar169) * local_18b8
                           + (fVar169 * (fVar98 + fVar105) - (fVar158 + fVar94) * fVar144) *
                             local_1a28;
                      auVar72._4_4_ =
                           (fVar150 * (fVar49 + fVar149) - (fVar106 + fVar108) * fVar120) * fVar11 +
                           ((fVar160 + fVar85) * fVar120 - (fVar49 + fVar149) * fVar173) *
                           fStack_18b4 +
                           (fVar173 * (fVar106 + fVar108) - (fVar160 + fVar85) * fVar150) *
                           fStack_1a24;
                      auVar72._8_4_ =
                           (fVar153 * (fVar50 + fVar152) - (fVar109 + fVar111) * fVar148) * fVar12 +
                           ((fVar162 + fVar88) * fVar148 - (fVar50 + fVar152) * fVar175) *
                           fStack_18b0 +
                           (fVar175 * (fVar109 + fVar111) - (fVar162 + fVar88) * fVar153) *
                           fStack_1a20;
                      auVar72._12_4_ =
                           (fVar157 * (fVar78 + fVar156) - (fVar112 + fVar114) * fVar73) * fVar13 +
                           ((fVar164 + fVar95) * fVar73 - (fVar78 + fVar156) * fVar177) *
                           fStack_18ac +
                           (fVar177 * (fVar112 + fVar114) - (fVar164 + fVar95) * fVar157) * fVar51;
                      fVar99 = fVar94 - fVar96;
                      fVar107 = fVar85 - fVar126;
                      fVar110 = fVar88 - fVar166;
                      fVar113 = fVar95 - fVar167;
                      fVar116 = fVar105 - fVar81;
                      fVar122 = fVar108 - fVar86;
                      fVar125 = fVar111 - fVar87;
                      fVar128 = fVar114 - fVar97;
                      fVar159 = fVar143 - fVar142;
                      fVar161 = fVar149 - fVar147;
                      fVar163 = fVar152 - fVar151;
                      fVar165 = fVar156 - fVar154;
                      in_XMM13_Da = (fVar96 + fVar94) * fVar116;
                      in_XMM13_Db = (fVar126 + fVar85) * fVar122;
                      in_XMM13_Dc = (fVar166 + fVar88) * fVar125;
                      in_XMM13_Dd = (fVar167 + fVar95) * fVar128;
                      auVar56._0_4_ =
                           (fVar116 * (fVar142 + fVar143) - (fVar81 + fVar105) * fVar159) * fVar10 +
                           ((fVar96 + fVar94) * fVar159 - (fVar142 + fVar143) * fVar99) * local_18b8
                           + (fVar99 * (fVar81 + fVar105) - (float)in_XMM13_Da) * local_1a28;
                      auVar56._4_4_ =
                           (fVar122 * (fVar147 + fVar149) - (fVar86 + fVar108) * fVar161) * fVar11 +
                           ((fVar126 + fVar85) * fVar161 - (fVar147 + fVar149) * fVar107) *
                           fStack_18b4 +
                           (fVar107 * (fVar86 + fVar108) - (float)in_XMM13_Db) * fStack_1a24;
                      auVar56._8_4_ =
                           (fVar125 * (fVar151 + fVar152) - (fVar87 + fVar111) * fVar163) * fVar12 +
                           ((fVar166 + fVar88) * fVar163 - (fVar151 + fVar152) * fVar110) *
                           fStack_18b0 +
                           (fVar110 * (fVar87 + fVar111) - (float)in_XMM13_Dc) * fStack_1a20;
                      auVar56._12_4_ =
                           (fVar128 * (fVar154 + fVar156) - (fVar97 + fVar114) * fVar165) * fVar13 +
                           ((fVar167 + fVar95) * fVar165 - (fVar154 + fVar156) * fVar113) *
                           fStack_18ac +
                           (fVar113 * (fVar97 + fVar114) - (float)in_XMM13_Dd) * fVar51;
                      fVar94 = fVar75 + auVar72._0_4_ + auVar56._0_4_;
                      fVar85 = fVar79 + auVar72._4_4_ + auVar56._4_4_;
                      fVar88 = auVar76._8_4_ + auVar72._8_4_ + auVar56._8_4_;
                      fVar95 = auVar76._12_4_ + auVar72._12_4_ + auVar56._12_4_;
                      auVar43._8_4_ = auVar76._8_4_;
                      auVar43._0_8_ = auVar76._0_8_;
                      auVar43._12_4_ = auVar76._12_4_;
                      auVar132 = minps(auVar43,auVar72);
                      auVar132 = minps(auVar132,auVar56);
                      auVar119._8_4_ = auVar76._8_4_;
                      auVar119._0_8_ = auVar76._0_8_;
                      auVar119._12_4_ = auVar76._12_4_;
                      auVar62 = maxps(auVar119,auVar72);
                      auVar62 = maxps(auVar62,auVar56);
                      fVar142 = ABS(fVar94) * 1.1920929e-07;
                      fVar147 = ABS(fVar85) * 1.1920929e-07;
                      fVar151 = ABS(fVar88) * 1.1920929e-07;
                      fVar154 = ABS(fVar95) * 1.1920929e-07;
                      local_1978 = auVar90._0_4_;
                      uStack_1974 = auVar90._4_4_;
                      uStack_1970 = auVar90._8_4_;
                      uStack_196c = auVar90._12_4_;
                      aVar118._0_8_ =
                           CONCAT44(-(uint)(auVar62._4_4_ <= fVar147 || -fVar147 <= auVar132._4_4_)
                                    & uStack_1974,
                                    -(uint)(auVar62._0_4_ <= fVar142 || -fVar142 <= auVar132._0_4_)
                                    & local_1978);
                      aVar118.i[2] = -(uint)(auVar62._8_4_ <= fVar151 || -fVar151 <= auVar132._8_4_)
                                     & uStack_1970;
                      aVar118.i[3] = -(uint)(auVar62._12_4_ <= fVar154 ||
                                            -fVar154 <= auVar132._12_4_) & uStack_196c;
                      iVar26 = movmskps((int)pGVar29,(undefined1  [16])aVar118);
                      if (iVar26 == 0) {
                        auVar93._8_4_ = aVar118.i[2];
                        auVar93._0_8_ = aVar118._0_8_;
                        auVar93._12_4_ = aVar118.i[3];
                      }
                      else {
                        auVar145._0_4_ = fVar144 * fVar159 - fVar116 * fVar89;
                        auVar145._4_4_ = fVar150 * fVar161 - fVar122 * fVar120;
                        auVar145._8_4_ = fVar153 * fVar163 - fVar125 * fVar148;
                        auVar145._12_4_ = fVar157 * fVar165 - fVar128 * fVar73;
                        in_XMM13_Da = ABS(fVar116 * fVar89);
                        in_XMM13_Db = ABS(fVar122 * fVar120);
                        in_XMM13_Dc = ABS(fVar125 * fVar148);
                        in_XMM13_Dd = ABS(fVar128 * fVar73);
                        auVar44._4_4_ = -(uint)(ABS(fVar150 * fVar83) < (float)in_XMM13_Db);
                        auVar44._0_4_ = -(uint)(ABS(fVar144 * fVar74) < (float)in_XMM13_Da);
                        auVar44._8_4_ = -(uint)(ABS(fVar153 * fVar123) < (float)in_XMM13_Dc);
                        auVar44._12_4_ = -(uint)(ABS(fVar157 * fVar155) < (float)in_XMM13_Dd);
                        auVar9._4_4_ = fVar121 * fVar120 - fVar150 * fVar83;
                        auVar9._0_4_ = fVar115 * fVar89 - fVar144 * fVar74;
                        auVar9._8_4_ = fVar124 * fVar148 - fVar153 * fVar123;
                        auVar9._12_4_ = fVar127 * fVar73 - fVar157 * fVar155;
                        auVar146 = blendvps(auVar145,auVar9,auVar44);
                        auVar134._0_4_ = fVar74 * fVar169 - fVar168 * fVar89;
                        auVar134._4_4_ = fVar83 * fVar173 - fVar172 * fVar120;
                        auVar134._8_4_ = fVar123 * fVar175 - fVar174 * fVar148;
                        auVar134._12_4_ = fVar155 * fVar177 - fVar176 * fVar73;
                        auVar101._0_4_ = fVar99 * fVar89 - fVar169 * fVar159;
                        auVar101._4_4_ = fVar107 * fVar120 - fVar173 * fVar161;
                        auVar101._8_4_ = fVar110 * fVar148 - fVar175 * fVar163;
                        auVar101._12_4_ = fVar113 * fVar73 - fVar177 * fVar165;
                        auVar45._4_4_ = -(uint)(ABS(fVar172 * fVar120) < ABS(fVar173 * fVar161));
                        auVar45._0_4_ = -(uint)(ABS(fVar168 * fVar89) < ABS(fVar169 * fVar159));
                        auVar45._8_4_ = -(uint)(ABS(fVar174 * fVar148) < ABS(fVar175 * fVar163));
                        auVar45._12_4_ = -(uint)(ABS(fVar176 * fVar73) < ABS(fVar177 * fVar165));
                        auVar62 = blendvps(auVar101,auVar134,auVar45);
                        auVar77._0_4_ = fVar168 * fVar144 - fVar169 * fVar115;
                        auVar77._4_4_ = fVar172 * fVar150 - fVar173 * fVar121;
                        auVar77._8_4_ = fVar174 * fVar153 - fVar175 * fVar124;
                        auVar77._12_4_ = fVar176 * fVar157 - fVar177 * fVar127;
                        auVar170._0_4_ = fVar169 * fVar116 - fVar99 * fVar144;
                        auVar170._4_4_ = fVar173 * fVar122 - fVar107 * fVar150;
                        auVar170._8_4_ = fVar175 * fVar125 - fVar110 * fVar153;
                        auVar170._12_4_ = fVar177 * fVar128 - fVar113 * fVar157;
                        auVar46._4_4_ = -(uint)(ABS(fVar173 * fVar121) < ABS(fVar107 * fVar150));
                        auVar46._0_4_ = -(uint)(ABS(fVar169 * fVar115) < ABS(fVar99 * fVar144));
                        auVar46._8_4_ = -(uint)(ABS(fVar175 * fVar124) < ABS(fVar110 * fVar153));
                        auVar46._12_4_ = -(uint)(ABS(fVar177 * fVar127) < ABS(fVar113 * fVar157));
                        auVar70 = blendvps(auVar170,auVar77,auVar46);
                        fVar142 = fVar10 * auVar146._0_4_ +
                                  local_18b8 * auVar62._0_4_ + local_1a28 * auVar70._0_4_;
                        fVar147 = fVar11 * auVar146._4_4_ +
                                  fStack_18b4 * auVar62._4_4_ + fStack_1a24 * auVar70._4_4_;
                        fVar151 = fVar12 * auVar146._8_4_ +
                                  fStack_18b0 * auVar62._8_4_ + fStack_1a20 * auVar70._8_4_;
                        fVar154 = fVar13 * auVar146._12_4_ +
                                  fStack_18ac * auVar62._12_4_ + fVar51 * auVar70._12_4_;
                        auVar91._0_4_ = fVar142 + fVar142;
                        auVar91._4_4_ = fVar147 + fVar147;
                        auVar91._8_4_ = fVar151 + fVar151;
                        auVar91._12_4_ = fVar154 + fVar154;
                        auVar57._0_4_ = fVar39 * auVar70._0_4_;
                        auVar57._4_4_ = fVar49 * auVar70._4_4_;
                        auVar57._8_4_ = fVar50 * auVar70._8_4_;
                        auVar57._12_4_ = fVar78 * auVar70._12_4_;
                        fVar51 = fVar158 * auVar146._0_4_ + fVar98 * auVar62._0_4_ + auVar57._0_4_;
                        fVar74 = fVar160 * auVar146._4_4_ + fVar106 * auVar62._4_4_ + auVar57._4_4_;
                        fVar89 = fVar162 * auVar146._8_4_ + fVar109 * auVar62._8_4_ + auVar57._8_4_;
                        fVar83 = fVar164 * auVar146._12_4_ +
                                 fVar112 * auVar62._12_4_ + auVar57._12_4_;
                        auVar132 = rcpps(auVar57,auVar91);
                        fVar142 = auVar132._0_4_;
                        fVar147 = auVar132._4_4_;
                        fVar151 = auVar132._8_4_;
                        fVar154 = auVar132._12_4_;
                        fVar142 = ((1.0 - auVar91._0_4_ * fVar142) * fVar142 + fVar142) *
                                  (fVar51 + fVar51);
                        fVar147 = ((1.0 - auVar91._4_4_ * fVar147) * fVar147 + fVar147) *
                                  (fVar74 + fVar74);
                        fVar151 = ((1.0 - auVar91._8_4_ * fVar151) * fVar151 + fVar151) *
                                  (fVar89 + fVar89);
                        fVar154 = ((1.0 - auVar91._12_4_ * fVar154) * fVar154 + fVar154) *
                                  (fVar83 + fVar83);
                        auVar92._0_4_ =
                             (int)((uint)((fVar142 <= *(float *)(ray + 0x80) &&
                                          *(float *)(ray + 0x30) <= fVar142) && auVar91._0_4_ != 0.0
                                         ) * -0x80000000) >> 0x1f;
                        auVar92._4_4_ =
                             (int)((uint)((fVar147 <= *(float *)(ray + 0x84) &&
                                          *(float *)(ray + 0x34) <= fVar147) && auVar91._4_4_ != 0.0
                                         ) * -0x80000000) >> 0x1f;
                        auVar92._8_4_ =
                             (int)((uint)((fVar151 <= *(float *)(ray + 0x88) &&
                                          *(float *)(ray + 0x38) <= fVar151) && auVar91._8_4_ != 0.0
                                         ) * -0x80000000) >> 0x1f;
                        auVar92._12_4_ =
                             (int)((uint)((fVar154 <= *(float *)(ray + 0x8c) &&
                                          *(float *)(ray + 0x3c) <= fVar154) &&
                                         auVar91._12_4_ != 0.0) * -0x80000000) >> 0x1f;
                        auVar93 = auVar92 & (undefined1  [16])aVar118;
                        iVar26 = movmskps(iVar26,auVar93);
                        if (iVar26 != 0) {
                          p_Stack_1990 = auVar76._8_8_;
                          uStack_1760 = p_Stack_1990;
                          local_1788 = CONCAT44(fVar85,fVar94);
                          uStack_1780 = CONCAT44(fVar95,fVar88);
                          local_17c8 = auVar70;
                          local_17b8 = auVar62;
                          local_17a8 = auVar146;
                          local_1798 = fVar142;
                          fStack_1794 = fVar147;
                          fStack_1790 = fVar151;
                          fStack_178c = fVar154;
                          _local_1778 = auVar72;
                          local_1768 = auVar76._0_8_;
                        }
                      }
                      pGVar29 = pRVar3[*(uint *)((long)&local_16e8 + uVar37 * 4)].ptr;
                      uVar20 = pGVar29->mask;
                      auVar58._0_4_ = -(uint)((uVar20 & *(uint *)(ray + 0x90)) == 0);
                      auVar58._4_4_ = -(uint)((uVar20 & *(uint *)(ray + 0x94)) == 0);
                      auVar58._8_4_ = -(uint)((uVar20 & *(uint *)(ray + 0x98)) == 0);
                      auVar58._12_4_ = -(uint)((uVar20 & *(uint *)(ray + 0x9c)) == 0);
                      aVar59 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)(~auVar58 & auVar93);
                      iVar26 = movmskps((int)pRVar3,(undefined1  [16])aVar59);
                      if (iVar26 == 0) {
                        uVar27 = 0;
                        aVar171 = _DAT_01f7a9f0;
                      }
                      else {
                        uVar27 = *(undefined4 *)((long)&local_16f8 + uVar37 * 4);
                        if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                           (pGVar29->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                          auVar17._8_8_ = uStack_1780;
                          auVar17._0_8_ = local_1788;
                          fVar51 = (float)((ulong)local_1788 >> 0x20);
                          fVar74 = (float)((ulong)uStack_1780 >> 0x20);
                          auVar132 = rcpps(_DAT_01f7b6c0,auVar17);
                          fVar142 = auVar132._0_4_;
                          fVar147 = auVar132._4_4_;
                          fVar151 = auVar132._8_4_;
                          fVar154 = auVar132._12_4_;
                          fVar142 = (float)(-(uint)(1e-18 <= (float)((uint)(float)local_1788 &
                                                                    (uint)DAT_01f7b6c0)) &
                                           (uint)(((float)DAT_01f7ba10 - (float)local_1788 * fVar142
                                                  ) * fVar142 + fVar142));
                          fVar147 = (float)(-(uint)(1e-18 <= (float)((uint)fVar51 &
                                                                    DAT_01f7b6c0._4_4_)) &
                                           (uint)((DAT_01f7ba10._4_4_ - fVar51 * fVar147) * fVar147
                                                 + fVar147));
                          fVar151 = (float)(-(uint)(1e-18 <= (float)((uint)(float)uStack_1780 &
                                                                    DAT_01f7b6c0._8_4_)) &
                                           (uint)((DAT_01f7ba10._8_4_ - (float)uStack_1780 * fVar151
                                                  ) * fVar151 + fVar151));
                          fVar154 = (float)(-(uint)(1e-18 <= (float)((uint)fVar74 &
                                                                    DAT_01f7b6c0._12_4_)) &
                                           (uint)((DAT_01f7ba10._12_4_ - fVar74 * fVar154) * fVar154
                                                 + fVar154));
                          auVar67._0_4_ = (float)local_1768 * fVar142;
                          auVar67._4_4_ = local_1768._4_4_ * fVar147;
                          auVar67._8_4_ = (float)uStack_1760 * fVar151;
                          auVar67._12_4_ = uStack_1760._4_4_ * fVar154;
                          minps(auVar67,_DAT_01f7ba10);
                          auVar47._0_4_ = fVar142 * (float)local_1778._0_4_;
                          auVar47._4_4_ = fVar147 * (float)local_1778._4_4_;
                          auVar47._8_4_ = fVar151 * fStack_1770;
                          auVar47._12_4_ = fVar154 * fStack_176c;
                          minps(auVar47,_DAT_01f7ba10);
                          p0.field_0._0_4_ = local_17a8._0_4_;
                          p0.field_0._4_4_ = local_17a8._4_4_;
                          p0.field_0._8_4_ = local_17a8._8_4_;
                          p0.field_0._12_4_ = local_17a8._12_4_;
                          p0.field_0._16_8_ = local_17b8._0_8_;
                          p0.field_0._24_8_ = local_17b8._8_8_;
                          p0.field_0._32_4_ = local_17c8._0_4_;
                          p0.field_0._36_4_ = local_17c8._4_4_;
                          p0.field_0._40_4_ = local_17c8._8_4_;
                          p0.field_0._44_4_ = local_17c8._12_4_;
                          auVar132 = *(undefined1 (*) [16])(ray + 0x80);
                          auVar16._4_4_ = fStack_1794;
                          auVar16._0_4_ = local_1798;
                          auVar16._8_4_ = fStack_1790;
                          auVar16._12_4_ = fStack_178c;
                          auVar62 = blendvps(auVar132,auVar16,(undefined1  [16])aVar59);
                          *(undefined1 (*) [16])(ray + 0x80) = auVar62;
                          itime.field_0 = aVar59;
                          p1.field_0._0_4_ = SUB84(&itime,0);
                          p1.field_0._4_4_ = (undefined4)((ulong)&itime >> 0x20);
                          p1.field_0._8_4_ = SUB84(pGVar29->userPtr,0);
                          p1.field_0._12_4_ = (undefined4)((ulong)pGVar29->userPtr >> 0x20);
                          p1.field_0._16_8_ = context->user;
                          p1.field_0._24_8_ = ray;
                          p1.field_0._32_8_ = &p0;
                          p1.field_0._40_4_ = 4;
                          uVar24 = pGVar29->occlusionFilterN;
                          p1.field_0._0_8_ = &itime;
                          if ((RTCFilterFunctionN)uVar24 != (RTCFilterFunctionN)0x0) {
                            valid_i = (vint<4> *)&p1;
                            uVar24 = (*(code *)uVar24)((RTCFilterFunctionNArguments *)valid_i);
                            aVar63 = _DAT_01f7a9f0;
                          }
                          if (itime.field_0 == (anon_union_16_2_9473010e_for_vint_impl<4>_1)0x0) {
                            auVar68._8_4_ = 0xffffffff;
                            auVar68._0_8_ = 0xffffffffffffffff;
                            auVar68._12_4_ = 0xffffffff;
                            auVar68 = auVar68 ^ _DAT_01f7ae20;
                          }
                          else {
                            p_Var5 = context->args->filter;
                            if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                (((pGVar29->field_8).field_0x2 & 0x40) != 0)))) {
                              valid_i = (vint<4> *)&p1;
                              (*p_Var5)((RTCFilterFunctionNArguments *)valid_i);
                              aVar63 = _DAT_01f7a9f0;
                            }
                            auVar60._0_4_ = -(uint)(itime.field_0._0_4_ == 0);
                            auVar60._4_4_ = -(uint)(itime.field_0._4_4_ == 0);
                            auVar60._8_4_ = -(uint)(itime.field_0._8_4_ == 0);
                            auVar60._12_4_ = -(uint)(itime.field_0._12_4_ == 0);
                            auVar68 = auVar60 ^ _DAT_01f7ae20;
                            auVar62 = blendvps(_DAT_01f7aa00,
                                               *(undefined1 (*) [16])(p1.field_0._24_8_ + 0x80),
                                               auVar60);
                            *(undefined1 (*) [16])(p1.field_0._24_8_ + 0x80) = auVar62;
                            uVar24 = p1.field_0._24_8_;
                          }
                          uVar27 = (undefined4)uVar24;
                          auVar69._0_4_ = auVar68._0_4_ << 0x1f;
                          auVar69._4_4_ = auVar68._4_4_ << 0x1f;
                          auVar69._8_4_ = auVar68._8_4_ << 0x1f;
                          auVar69._12_4_ = auVar68._12_4_ << 0x1f;
                          aVar59._0_4_ = auVar69._0_4_ >> 0x1f;
                          aVar59._4_4_ = auVar69._4_4_ >> 0x1f;
                          aVar59._8_4_ = auVar69._8_4_ >> 0x1f;
                          aVar59._12_4_ = auVar69._12_4_ >> 0x1f;
                          auVar132 = blendvps(auVar132,*(undefined1 (*) [16])(ray + 0x80),auVar69);
                          *(undefined1 (*) [16])(ray + 0x80) = auVar132;
                        }
                        auVar90 = ~(undefined1  [16])aVar59 & auVar90;
                        aVar171 = aVar63;
                      }
                      uVar20 = movmskps(uVar27,auVar90);
                      uVar23 = (ulong)uVar20;
                      if ((uVar20 == 0) ||
                         (uVar23 = uVar37 + 1, bVar38 = 2 < uVar37, uVar37 = uVar23, bVar38)) break;
                    }
                    auVar103._0_4_ = auVar100._0_4_ & auVar90._0_4_;
                    auVar103._4_4_ = auVar100._4_4_ & auVar90._4_4_;
                    auVar103._8_4_ = auVar100._8_4_ & auVar90._8_4_;
                    auVar103._12_4_ = auVar100._12_4_ & auVar90._12_4_;
                    iVar26 = movmskps((int)uVar23,auVar103);
                  } while ((iVar26 != 0) &&
                          (uVar25 = uVar25 + 1, auVar100 = auVar103, uVar25 < uVar21 - 8));
                  uVar129 = (uint)uVar25;
                  uVar21 = CONCAT44(auVar103._4_4_,auVar103._0_4_);
                  aVar104._0_8_ = uVar21 ^ 0xffffffffffffffff;
                  aVar104._8_4_ = auVar103._8_4_ ^ 0xffffffff;
                  aVar104._12_4_ = auVar103._12_4_ ^ 0xffffffff;
                }
                terminated.field_0 =
                     (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
                     ((undefined1  [16])terminated.field_0 | (undefined1  [16])aVar104);
                uVar20 = movmskps(uVar129,(undefined1  [16])terminated.field_0);
                sVar22 = (size_t)uVar20;
                if (uVar20 == 0xf) goto LAB_00dbd6d2;
                tray.tfar.field_0 =
                     (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     blendvps((undefined1  [16])tray.tfar.field_0,_DAT_01f7aa00,
                              (undefined1  [16])terminated.field_0);
              }
              goto LAB_00dbc5f6;
            }
            uVar21 = root.ptr & 0xfffffffffffffff0;
            lVar28 = -0x10;
            pBVar30 = (BVH *)0x8;
            aVar63 = aVar171;
            do {
              pBVar33 = *(BVH **)(uVar21 + 0x20 + lVar28 * 2);
              root.ptr = (size_t)pBVar30;
              if (pBVar33 == (BVH *)0x8) break;
              fVar51 = *(float *)(uVar21 + 0x90 + lVar28);
              fVar74 = *(float *)(uVar21 + 0x30 + lVar28);
              fVar89 = *(float *)(uVar21 + 0x40 + lVar28);
              fVar83 = *(float *)(uVar21 + 0x50 + lVar28);
              fVar94 = *(float *)(uVar21 + 0x60 + lVar28);
              fVar98 = *(float *)(ray + 0x70);
              fVar106 = *(float *)(ray + 0x74);
              fVar109 = *(float *)(ray + 0x78);
              fVar112 = *(float *)(ray + 0x7c);
              fVar85 = *(float *)(uVar21 + 0xb0 + lVar28);
              fVar88 = *(float *)(uVar21 + 0xd0 + lVar28);
              fVar95 = *(float *)(uVar21 + 0x70 + lVar28);
              fVar96 = *(float *)(uVar21 + 0xa0 + lVar28);
              fVar126 = *(float *)(uVar21 + 0xc0 + lVar28);
              fVar166 = *(float *)(uVar21 + 0xe0 + lVar28);
              fVar167 = *(float *)(uVar21 + 0x80 + lVar28);
              fVar148 = (float)((ulong)tray.org.field_0._32_8_ >> 0x20);
              fVar155 = (float)((ulong)tray.org.field_0._40_8_ >> 0x20);
              fVar39 = ((fVar51 * fVar98 + fVar74) - (float)tray.org.field_0._0_4_) *
                       (float)tray.rdir.field_0._0_4_;
              fVar49 = ((fVar51 * fVar106 + fVar74) - (float)tray.org.field_0._4_4_) *
                       (float)tray.rdir.field_0._4_4_;
              fVar50 = ((fVar51 * fVar109 + fVar74) - (float)tray.org.field_0._8_4_) *
                       (float)tray.rdir.field_0._8_4_;
              fVar51 = ((fVar51 * fVar112 + fVar74) - (float)tray.org.field_0._12_4_) *
                       (float)tray.rdir.field_0._12_4_;
              fVar74 = ((fVar85 * fVar98 + fVar83) - (float)tray.org.field_0._16_4_) *
                       (float)tray.rdir.field_0._16_4_;
              fVar78 = ((fVar85 * fVar106 + fVar83) - (float)tray.org.field_0._20_4_) *
                       (float)tray.rdir.field_0._20_4_;
              fVar81 = ((fVar85 * fVar109 + fVar83) - (float)tray.org.field_0._24_4_) *
                       (float)tray.rdir.field_0._24_4_;
              fVar83 = ((fVar85 * fVar112 + fVar83) - (float)tray.org.field_0._28_4_) *
                       (float)tray.rdir.field_0._28_4_;
              fVar85 = ((fVar88 * fVar98 + fVar95) - (float)tray.org.field_0._32_8_) *
                       (float)tray.rdir.field_0._32_4_;
              fVar86 = ((fVar88 * fVar106 + fVar95) - fVar148) * (float)tray.rdir.field_0._36_4_;
              fVar87 = ((fVar88 * fVar109 + fVar95) - (float)tray.org.field_0._40_8_) *
                       (float)tray.rdir.field_0._40_4_;
              fVar88 = ((fVar88 * fVar112 + fVar95) - fVar155) * (float)tray.rdir.field_0._44_4_;
              fVar97 = ((fVar96 * fVar98 + fVar89) - (float)tray.org.field_0._0_4_) *
                       (float)tray.rdir.field_0._0_4_;
              fVar105 = ((fVar96 * fVar106 + fVar89) - (float)tray.org.field_0._4_4_) *
                        (float)tray.rdir.field_0._4_4_;
              fVar108 = ((fVar96 * fVar109 + fVar89) - (float)tray.org.field_0._8_4_) *
                        (float)tray.rdir.field_0._8_4_;
              fVar111 = ((fVar96 * fVar112 + fVar89) - (float)tray.org.field_0._12_4_) *
                        (float)tray.rdir.field_0._12_4_;
              fVar114 = ((fVar126 * fVar98 + fVar94) - (float)tray.org.field_0._16_4_) *
                        (float)tray.rdir.field_0._16_4_;
              fVar120 = ((fVar126 * fVar106 + fVar94) - (float)tray.org.field_0._20_4_) *
                        (float)tray.rdir.field_0._20_4_;
              fVar123 = ((fVar126 * fVar109 + fVar94) - (float)tray.org.field_0._24_4_) *
                        (float)tray.rdir.field_0._24_4_;
              fVar126 = ((fVar126 * fVar112 + fVar94) - (float)tray.org.field_0._28_4_) *
                        (float)tray.rdir.field_0._28_4_;
              fVar89 = ((fVar166 * fVar98 + fVar167) - (float)tray.org.field_0._32_8_) *
                       (float)tray.rdir.field_0._32_4_;
              fVar94 = ((fVar166 * fVar106 + fVar167) - fVar148) * (float)tray.rdir.field_0._36_4_;
              fVar95 = ((fVar166 * fVar109 + fVar167) - (float)tray.org.field_0._40_8_) *
                       (float)tray.rdir.field_0._40_4_;
              fVar96 = ((fVar166 * fVar112 + fVar167) - fVar155) * (float)tray.rdir.field_0._44_4_;
              uVar129 = (uint)((int)fVar97 < (int)fVar39) * (int)fVar97 |
                        (uint)((int)fVar97 >= (int)fVar39) * (int)fVar39;
              uVar135 = (uint)((int)fVar105 < (int)fVar49) * (int)fVar105 |
                        (uint)((int)fVar105 >= (int)fVar49) * (int)fVar49;
              uVar136 = (uint)((int)fVar108 < (int)fVar50) * (int)fVar108 |
                        (uint)((int)fVar108 >= (int)fVar50) * (int)fVar50;
              uVar137 = (uint)((int)fVar111 < (int)fVar51) * (int)fVar111 |
                        (uint)((int)fVar111 >= (int)fVar51) * (int)fVar51;
              uVar138 = (uint)((int)fVar114 < (int)fVar74) * (int)fVar114 |
                        (uint)((int)fVar114 >= (int)fVar74) * (int)fVar74;
              uVar139 = (uint)((int)fVar120 < (int)fVar78) * (int)fVar120 |
                        (uint)((int)fVar120 >= (int)fVar78) * (int)fVar78;
              uVar140 = (uint)((int)fVar123 < (int)fVar81) * (int)fVar123 |
                        (uint)((int)fVar123 >= (int)fVar81) * (int)fVar81;
              uVar141 = (uint)((int)fVar126 < (int)fVar83) * (int)fVar126 |
                        (uint)((int)fVar126 >= (int)fVar83) * (int)fVar83;
              uVar138 = ((int)uVar138 < (int)uVar129) * uVar129 |
                        ((int)uVar138 >= (int)uVar129) * uVar138;
              uVar139 = ((int)uVar139 < (int)uVar135) * uVar135 |
                        ((int)uVar139 >= (int)uVar135) * uVar139;
              uVar140 = ((int)uVar140 < (int)uVar136) * uVar136 |
                        ((int)uVar140 >= (int)uVar136) * uVar140;
              uVar141 = ((int)uVar141 < (int)uVar137) * uVar137 |
                        ((int)uVar141 >= (int)uVar137) * uVar141;
              uVar129 = (uint)((int)fVar89 < (int)fVar85) * (int)fVar89 |
                        (uint)((int)fVar89 >= (int)fVar85) * (int)fVar85;
              uVar135 = (uint)((int)fVar94 < (int)fVar86) * (int)fVar94 |
                        (uint)((int)fVar94 >= (int)fVar86) * (int)fVar86;
              uVar136 = (uint)((int)fVar95 < (int)fVar87) * (int)fVar95 |
                        (uint)((int)fVar95 >= (int)fVar87) * (int)fVar87;
              uVar137 = (uint)((int)fVar96 < (int)fVar88) * (int)fVar96 |
                        (uint)((int)fVar96 >= (int)fVar88) * (int)fVar88;
              auVar130._0_4_ =
                   (float)(((int)uVar129 < (int)uVar138) * uVar138 |
                          ((int)uVar129 >= (int)uVar138) * uVar129) * 0.99999964;
              auVar130._4_4_ =
                   (float)(((int)uVar135 < (int)uVar139) * uVar139 |
                          ((int)uVar135 >= (int)uVar139) * uVar135) * 0.99999964;
              auVar130._8_4_ =
                   (float)(((int)uVar136 < (int)uVar140) * uVar140 |
                          ((int)uVar136 >= (int)uVar140) * uVar136) * 0.99999964;
              auVar130._12_4_ =
                   (float)(((int)uVar137 < (int)uVar141) * uVar141 |
                          ((int)uVar137 >= (int)uVar141) * uVar137) * 0.99999964;
              uVar129 = (uint)((int)fVar97 < (int)fVar39) * (int)fVar39 |
                        (uint)((int)fVar97 >= (int)fVar39) * (int)fVar97;
              uVar135 = (uint)((int)fVar105 < (int)fVar49) * (int)fVar49 |
                        (uint)((int)fVar105 >= (int)fVar49) * (int)fVar105;
              uVar136 = (uint)((int)fVar108 < (int)fVar50) * (int)fVar50 |
                        (uint)((int)fVar108 >= (int)fVar50) * (int)fVar108;
              uVar137 = (uint)((int)fVar111 < (int)fVar51) * (int)fVar51 |
                        (uint)((int)fVar111 >= (int)fVar51) * (int)fVar111;
              uVar138 = (uint)((int)fVar114 < (int)fVar74) * (int)fVar74 |
                        (uint)((int)fVar114 >= (int)fVar74) * (int)fVar114;
              uVar139 = (uint)((int)fVar120 < (int)fVar78) * (int)fVar78 |
                        (uint)((int)fVar120 >= (int)fVar78) * (int)fVar120;
              uVar140 = (uint)((int)fVar123 < (int)fVar81) * (int)fVar81 |
                        (uint)((int)fVar123 >= (int)fVar81) * (int)fVar123;
              uVar141 = (uint)((int)fVar126 < (int)fVar83) * (int)fVar83 |
                        (uint)((int)fVar126 >= (int)fVar83) * (int)fVar126;
              aVar118.i[0] = ((int)uVar129 < (int)uVar138) * uVar129 |
                             ((int)uVar129 >= (int)uVar138) * uVar138;
              aVar118.i[1] = ((int)uVar135 < (int)uVar139) * uVar135 |
                             ((int)uVar135 >= (int)uVar139) * uVar139;
              aVar118.i[2] = ((int)uVar136 < (int)uVar140) * uVar136 |
                             ((int)uVar136 >= (int)uVar140) * uVar140;
              aVar118.i[3] = ((int)uVar137 < (int)uVar141) * uVar137 |
                             ((int)uVar137 >= (int)uVar141) * uVar141;
              uVar129 = (uint)((int)fVar89 < (int)fVar85) * (int)fVar85 |
                        (uint)((int)fVar89 >= (int)fVar85) * (int)fVar89;
              uVar135 = (uint)((int)fVar94 < (int)fVar86) * (int)fVar86 |
                        (uint)((int)fVar94 >= (int)fVar86) * (int)fVar94;
              uVar136 = (uint)((int)fVar95 < (int)fVar87) * (int)fVar87 |
                        (uint)((int)fVar95 >= (int)fVar87) * (int)fVar95;
              uVar137 = (uint)((int)fVar96 < (int)fVar88) * (int)fVar88 |
                        (uint)((int)fVar96 >= (int)fVar88) * (int)fVar96;
              fVar51 = (float)((uint)(aVar118.i[0] < (int)uVar129) * aVar118.i[0] |
                              (aVar118.i[0] >= (int)uVar129) * uVar129) * 1.0000004;
              fVar74 = (float)((uint)(aVar118.i[1] < (int)uVar135) * aVar118.i[1] |
                              (aVar118.i[1] >= (int)uVar135) * uVar135) * 1.0000004;
              fVar89 = (float)((uint)(aVar118.i[2] < (int)uVar136) * aVar118.i[2] |
                              (aVar118.i[2] >= (int)uVar136) * uVar136) * 1.0000004;
              fVar83 = (float)((uint)(aVar118.i[3] < (int)uVar137) * aVar118.i[3] |
                              (aVar118.i[3] >= (int)uVar137) * uVar137) * 1.0000004;
              bVar38 = (float)((uint)(tray.tnear.field_0.i[0] < (int)auVar130._0_4_) *
                               (int)auVar130._0_4_ |
                              (uint)(tray.tnear.field_0.i[0] >= (int)auVar130._0_4_) *
                              tray.tnear.field_0.i[0]) <=
                       (float)((uint)(tray.tfar.field_0.i[0] < (int)fVar51) * tray.tfar.field_0.i[0]
                              | (uint)(tray.tfar.field_0.i[0] >= (int)fVar51) * (int)fVar51);
              bVar6 = (float)((uint)(tray.tnear.field_0.i[1] < (int)auVar130._4_4_) *
                              (int)auVar130._4_4_ |
                             (uint)(tray.tnear.field_0.i[1] >= (int)auVar130._4_4_) *
                             tray.tnear.field_0.i[1]) <=
                      (float)((uint)(tray.tfar.field_0.i[1] < (int)fVar74) * tray.tfar.field_0.i[1]
                             | (uint)(tray.tfar.field_0.i[1] >= (int)fVar74) * (int)fVar74);
              bVar7 = (float)((uint)(tray.tnear.field_0.i[2] < (int)auVar130._8_4_) *
                              (int)auVar130._8_4_ |
                             (uint)(tray.tnear.field_0.i[2] >= (int)auVar130._8_4_) *
                             tray.tnear.field_0.i[2]) <=
                      (float)((uint)(tray.tfar.field_0.i[2] < (int)fVar89) * tray.tfar.field_0.i[2]
                             | (uint)(tray.tfar.field_0.i[2] >= (int)fVar89) * (int)fVar89);
              bVar8 = (float)((uint)(tray.tnear.field_0.i[3] < (int)auVar130._12_4_) *
                              (int)auVar130._12_4_ |
                             (uint)(tray.tnear.field_0.i[3] >= (int)auVar130._12_4_) *
                             tray.tnear.field_0.i[3]) <=
                      (float)((uint)(tray.tfar.field_0.i[3] < (int)fVar83) * tray.tfar.field_0.i[3]
                             | (uint)(tray.tfar.field_0.i[3] >= (int)fVar83) * (int)fVar83);
              if ((uVar20 & 7) == 6) {
                fVar51 = *(float *)(uVar21 + 0xf0 + lVar28);
                fVar74 = *(float *)(uVar21 + 0x100 + lVar28);
                bVar38 = (fVar98 < fVar74 && fVar51 <= fVar98) && bVar38;
                bVar6 = (fVar106 < fVar74 && fVar51 <= fVar106) && bVar6;
                bVar7 = (fVar109 < fVar74 && fVar51 <= fVar109) && bVar7;
                bVar8 = (fVar112 < fVar74 && fVar51 <= fVar112) && bVar8;
              }
              auVar40._0_4_ = (-(uint)bVar38 & -(uint)(fVar142 < tray.tfar.field_0.v[0])) << 0x1f;
              auVar40._4_4_ = (-(uint)bVar6 & -(uint)(fVar147 < tray.tfar.field_0.v[1])) << 0x1f;
              auVar40._8_4_ = (-(uint)bVar7 & -(uint)(fVar151 < tray.tfar.field_0.v[2])) << 0x1f;
              auVar40._12_4_ = (-(uint)bVar8 & -(uint)(fVar154 < tray.tfar.field_0.v[3])) << 0x1f;
              uVar129 = movmskps((int)valid_i,auVar40);
              valid_i = (vint<4> *)(ulong)uVar129;
              aVar71 = aVar63;
              if ((uVar129 != 0) &&
                 (aVar71.v = (__m128)blendvps(aVar171.v,auVar130,auVar40),
                 root.ptr = (size_t)pBVar33, pBVar30 != (BVH *)0x8)) {
                pNVar35->ptr = (size_t)pBVar30;
                pNVar35 = pNVar35 + 1;
                *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar36->v = aVar63;
                paVar36 = paVar36 + 1;
              }
              aVar63 = aVar71;
              lVar28 = lVar28 + 4;
              pBVar30 = (BVH *)root.ptr;
              in_XMM13_Da = tray.rdir.field_0._16_4_;
              in_XMM13_Db = tray.rdir.field_0._20_4_;
              in_XMM13_Dc = tray.rdir.field_0._24_4_;
              in_XMM13_Dd = tray.rdir.field_0._28_4_;
            } while (lVar28 != 0);
            sVar22 = 4;
            pBVar30 = (BVH *)root.ptr;
            if ((BVH *)root.ptr == (BVH *)0x8) goto LAB_00dbc8c6;
            auVar41._4_4_ = -(uint)(aVar63.v[1] < tray.tfar.field_0.v[1]);
            auVar41._0_4_ = -(uint)(aVar63.v[0] < tray.tfar.field_0.v[0]);
            auVar41._8_4_ = -(uint)(aVar63.v[2] < tray.tfar.field_0.v[2]);
            auVar41._12_4_ = -(uint)(aVar63.v[3] < tray.tfar.field_0.v[3]);
            uVar27 = movmskps((int)lVar28,auVar41);
          } while ((byte)uVar31 < (byte)POPCOUNT(uVar27));
          pNVar35->ptr = root.ptr;
          pNVar35 = pNVar35 + 1;
          *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar36->v = aVar63;
          paVar36 = paVar36 + 1;
        }
        else {
          do {
            sVar22 = 0;
            if (uVar21 != 0) {
              for (; (uVar21 >> sVar22 & 1) == 0; sVar22 = sVar22 + 1) {
              }
            }
            pBVar30 = bvh;
            valid_i = (vint<4> *)This;
            bVar38 = occluded1(This,bvh,root,sVar22,&pre,ray,&tray,context);
            if (bVar38) {
              terminated.field_0.i[sVar22] = -1;
            }
            uVar25 = uVar21 - 1;
            uVar21 = uVar21 & uVar25;
          } while (uVar21 != 0);
          iVar26 = movmskps((int)uVar25,(undefined1  [16])terminated.field_0);
          if (iVar26 == 0xf) {
            sVar22 = 3;
          }
          else {
            tray.tfar.field_0 =
                 (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                 blendvps((undefined1  [16])tray.tfar.field_0,_DAT_01f7aa00,
                          (undefined1  [16])terminated.field_0);
            sVar22 = 2;
          }
          aVar171 = _DAT_01f7a9f0;
          if (uVar31 < (uint)POPCOUNT(uVar20 & 0xff)) goto LAB_00dbc637;
        }
LAB_00dbc8c6:
      } while (((int)sVar22 == 4) || ((int)sVar22 == 2));
LAB_00dbd6d2:
      auVar48._0_4_ = uVar52 & terminated.field_0.i[0];
      auVar48._4_4_ = uVar61 & terminated.field_0.i[1];
      auVar48._8_4_ = auVar53._8_4_ & terminated.field_0.i[2];
      auVar48._12_4_ = auVar53._12_4_ & terminated.field_0.i[3];
      auVar90 = blendvps(*(undefined1 (*) [16])(ray + 0x80),_DAT_01f7aa00,auVar48);
      *(undefined1 (*) [16])(ray + 0x80) = auVar90;
      return;
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }